

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool __thiscall
testing::internal::FloatingPoint<double>::AlmostEquals
          (FloatingPoint<double> *this,FloatingPoint<double> *rhs)

{
  bool bVar1;
  Bits BVar2;
  Bits *in_RSI;
  FloatingPoint<double> *in_RDI;
  FloatingPoint<double> *sam1;
  
  sam1 = in_RDI;
  bVar1 = is_nan(in_RDI);
  if ((!bVar1) && (bVar1 = is_nan(in_RDI), !bVar1)) {
    BVar2 = DistanceBetweenSignAndMagnitudeNumbers((Bits *)sam1,in_RSI);
    return BVar2 < 5;
  }
  return false;
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }